

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.h
# Opt level: O2

void CAddress::
     SerializationOps<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>,CAddress,ActionUnserialize>
               (long obj,ParamsStream<HashVerifier<AutoFile>_&,_CAddress::SerParams> *s)

{
  Encoding EVar1;
  SerParams *pSVar2;
  uint32_t uVar3;
  SerParams *pSVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  SerParams ser_params;
  undefined4 uStack_3c;
  uint64_t services_tmp;
  long local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar2 = s->m_params;
  if (pSVar2->fmt == Network) {
    EVar1 = (pSVar2->super_SerParams).enc;
    uVar3 = ser_readdata32<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>>(s);
    *(ulong *)(obj + 0x28) = (ulong)uVar3;
    if (EVar1 != V2) goto LAB_006a62a9;
LAB_006a6276:
    _ser_params = &services_tmp;
    Wrapper<CompactSizeFormatter<false>,unsigned_long&>::
    Unserialize<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>>
              ((Wrapper<CompactSizeFormatter<false>,unsigned_long&> *)&ser_params,s);
    *(uint64_t *)(obj + 0x30) = services_tmp;
    pSVar4 = &CNetAddr::V2;
  }
  else {
    if (pSVar2->fmt != Disk) {
      __assert_fail("params.fmt == Format::Network",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/protocol.h"
                    ,0x1b2,
                    "static void CAddress::SerializationOps(Type &, Stream &, Operation) [Stream = ParamsStream<HashVerifier<AutoFile> &, CAddress::SerParams>, Type = CAddress, Operation = ActionUnserialize]"
                   );
    }
    uVar3 = ser_readdata32<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>>(s);
    if ((uVar3 & 0xfff80000) != 0) {
      if (((uVar3 & 0xfff80000) != 0x20000000) || ((pSVar2->super_SerParams).enc != V2)) {
        pcVar5 = (char *)__cxa_allocate_exception(0x20);
        local_30 = std::iostream_category();
        services_tmp = CONCAT44(services_tmp._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar5,(error_code *)"Unsupported CAddress disk format version");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_006a639a;
      }
      uVar3 = ser_readdata32<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>>(s);
      *(ulong *)(obj + 0x28) = (ulong)uVar3;
      goto LAB_006a6276;
    }
    uVar3 = ser_readdata32<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>>(s);
    *(ulong *)(obj + 0x28) = (ulong)uVar3;
LAB_006a62a9:
    services_tmp = obj + 0x30;
    Wrapper<CustomUintFormatter<8,false>,ServiceFlags&>::
    Unserialize<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>>
              ((Wrapper<CustomUintFormatter<8,false>,ServiceFlags&> *)&services_tmp,s);
    pSVar4 = &CNetAddr::V1;
  }
  services_tmp = (uint64_t)&ser_params;
  _ser_params = (uint64_t *)CONCAT44(uStack_3c,pSVar4->enc);
  local_30 = obj;
  ParamsWrapper<CNetAddr::SerParams,CService>::
  Unserialize<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>>
            ((ParamsWrapper<CNetAddr::SerParams,CService> *)&services_tmp,s);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_006a639a:
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(CAddress, obj)
    {
        bool use_v2;
        auto& params = SER_PARAMS(SerParams);
        if (params.fmt == Format::Disk) {
            // In the disk serialization format, the encoding (v1 or v2) is determined by a flag version
            // that's part of the serialization itself. ADDRV2_FORMAT in the stream version only determines
            // whether V2 is chosen/permitted at all.
            uint32_t stored_format_version = DISK_VERSION_INIT;
            if (params.enc == Encoding::V2) stored_format_version |= DISK_VERSION_ADDRV2;
            READWRITE(stored_format_version);
            stored_format_version &= ~DISK_VERSION_IGNORE_MASK; // ignore low bits
            if (stored_format_version == 0) {
                use_v2 = false;
            } else if (stored_format_version == DISK_VERSION_ADDRV2 && params.enc == Encoding::V2) {
                // Only support v2 deserialization if V2 is set.
                use_v2 = true;
            } else {
                throw std::ios_base::failure("Unsupported CAddress disk format version");
            }
        } else {
            assert(params.fmt == Format::Network);
            // In the network serialization format, the encoding (v1 or v2) is determined directly by
            // the value of enc in the stream params, as no explicitly encoded version
            // exists in the stream.
            use_v2 = params.enc == Encoding::V2;
        }

        READWRITE(Using<LossyChronoFormatter<uint32_t>>(obj.nTime));
        // nServices is serialized as CompactSize in V2; as uint64_t in V1.
        if (use_v2) {
            uint64_t services_tmp;
            SER_WRITE(obj, services_tmp = obj.nServices);
            READWRITE(Using<CompactSizeFormatter<false>>(services_tmp));
            SER_READ(obj, obj.nServices = static_cast<ServiceFlags>(services_tmp));
        } else {
            READWRITE(Using<CustomUintFormatter<8>>(obj.nServices));
        }
        // Invoke V1/V2 serializer for CService parent object.
        const auto ser_params{use_v2 ? CNetAddr::V2 : CNetAddr::V1};
        READWRITE(ser_params(AsBase<CService>(obj)));
    }